

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIStaticText.cpp
# Opt level: O3

void __thiscall irr::gui::CGUIStaticText::breakText(CGUIStaticText *this)

{
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar1;
  IGUIFont *pIVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  u32 begin;
  long *plVar6;
  undefined4 extraout_var;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  size_type __pos_1;
  ulong uVar11;
  size_type __pos;
  ulong uVar12;
  wchar_t wVar13;
  bool bVar14;
  stringw first;
  stringw word;
  stringw second;
  stringw line;
  stringw whitespace;
  string<wchar_t> local_140;
  vector<irr::core::string<wchar_t>,std::allocator<irr::core::string<wchar_t>>> *local_120;
  int local_114;
  string<wchar_t> local_110;
  ulong local_f0;
  string<wchar_t> local_e8;
  undefined1 local_c8 [32];
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  local_a8;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  local_98;
  long *local_88;
  IGUIFont *local_80;
  undefined8 local_78;
  string<wchar_t> local_70;
  string<wchar_t> local_50;
  
  if (this->WordWrap == true) {
    local_c8._0_8_ =
         (this->BrokenText).m_data.
         super__Vector_base<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_c8._8_8_ =
         (this->BrokenText).m_data.
         super__Vector_base<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_c8._16_8_ =
         (this->BrokenText).m_data.
         super__Vector_base<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->BrokenText).m_data.
    super__Vector_base<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this->BrokenText).m_data.
    super__Vector_base<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->BrokenText).m_data.
    super__Vector_base<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>::~vector
              ((vector<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_> *)
               local_c8);
    (this->BrokenText).is_sorted = true;
    plVar6 = (long *)(**(code **)(**(long **)&this->field_0x128 + 0x60))();
    local_80 = (IGUIFont *)(**(code **)(*(long *)this + 0x130))(this);
    if (local_80 != (IGUIFont *)0x0) {
      this->LastBreakFont = local_80;
      local_c8._0_8_ = local_c8 + 0x10;
      local_c8._8_8_ = (pointer)0x0;
      local_c8._16_8_ = local_c8._16_8_ & 0xffffffff00000000;
      local_110.str._M_dataplus._M_p = (pointer)&local_110.str.field_2;
      local_110.str._M_string_length = 0;
      local_110.str.field_2._M_local_buf[0] = L'\0';
      local_a8._M_allocated_capacity = (size_type)&local_98;
      local_a8._8_8_ = 0;
      local_98._M_local_buf[0] = L'\0';
      uVar9 = *(ulong *)&this->field_0xb0;
      iVar10 = *(int *)&this->field_0x38 - *(int *)&this->field_0x30;
      if (this->Border == true) {
        iVar3 = (**(code **)(*plVar6 + 0x10))(plVar6,8);
        iVar10 = iVar10 + iVar3 * -2;
      }
      local_120 = (vector<irr::core::string<wchar_t>,std::allocator<irr::core::string<wchar_t>>> *)
                  &this->BrokenText;
      local_88 = (long *)&this->field_0xa8;
      uVar4 = (uint)uVar9;
      local_114 = iVar10;
      if (this->RightToLeft == false) {
        if (0 < (int)uVar4) {
          iVar10 = 0;
          uVar11 = 1;
          do {
            lVar7 = *local_88;
            uVar4 = *(uint *)(lVar7 + -4 + uVar11 * 4);
            if (uVar4 == 10) {
LAB_00224e1f:
              uVar8 = CONCAT71((int7)((ulong)lVar7 >> 8),1);
              bVar14 = true;
              uVar12 = local_110.str._M_string_length & 0xffffffff;
LAB_00224e2b:
              pIVar2 = local_80;
              iVar3 = iVar10;
              if ((int)uVar12 != 0) {
                local_f0 = CONCAT44(local_f0._4_4_,(int)uVar8);
                iVar5 = (*local_80->_vptr_IGUIFont[1])(local_80,local_a8._M_allocated_capacity);
                iVar3 = (*pIVar2->_vptr_IGUIFont[1])(pIVar2,local_110.str._M_dataplus._M_p);
                if (local_114 < iVar3) {
                  begin = ::std::__cxx11::wstring::find((wchar_t)&local_110,0xad);
                  if (begin == 0xffffffff) {
                    if (iVar10 != 0) {
LAB_0022506a:
                      std::
                      vector<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>
                      ::push_back((vector<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>
                                   *)local_120,(value_type *)local_c8);
                      (this->BrokenText).is_sorted = false;
                    }
                    ::std::__cxx11::wstring::_M_assign((wstring *)local_c8);
                  }
                  else {
                    core::string<wchar_t>::subString(&local_140,&local_110,0,begin,false);
                    core::string<wchar_t>::subString
                              (&local_e8,&local_110,begin,
                               (int)local_110.str._M_string_length - begin,false);
                    core::string<wchar_t>::operator+
                              (&local_70,(string<wchar_t> *)local_c8,&local_140);
                    core::string<wchar_t>::operator+(&local_50,&local_70,L"-");
                    ::std::
                    vector<irr::core::string<wchar_t>,std::allocator<irr::core::string<wchar_t>>>::
                    emplace_back<irr::core::string<wchar_t>>(local_120,&local_50);
                    (this->BrokenText).is_sorted = false;
                    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                         *)local_50.str._M_dataplus._M_p != &local_50.str.field_2) {
                      operator_delete(local_50.str._M_dataplus._M_p,
                                      local_50.str.field_2._M_allocated_capacity * 4 + 4);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                         *)local_70.str._M_dataplus._M_p != &local_70.str.field_2) {
                      operator_delete(local_70.str._M_dataplus._M_p,
                                      local_70.str.field_2._M_allocated_capacity * 4 + 4);
                    }
                    iVar3 = (*local_80->_vptr_IGUIFont[1])(local_80,local_e8.str._M_dataplus._M_p);
                    ::std::__cxx11::wstring::_M_assign((wstring *)local_c8);
                    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                         *)local_e8.str._M_dataplus._M_p != &local_e8.str.field_2) {
                      operator_delete(local_e8.str._M_dataplus._M_p,
                                      CONCAT44(local_e8.str.field_2._M_local_buf[1],
                                               local_e8.str.field_2._M_local_buf[0]) * 4 + 4);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                         *)local_140.str._M_dataplus._M_p != &local_140.str.field_2) {
                      operator_delete(local_140.str._M_dataplus._M_p,
                                      local_140.str.field_2._M_allocated_capacity * 4 + 4);
                    }
                  }
                }
                else {
                  if (iVar10 == 0) {
                    iVar10 = iVar5 + iVar3;
                  }
                  else {
                    iVar10 = iVar10 + iVar5 + iVar3;
                    if (local_114 < iVar10) goto LAB_0022506a;
                  }
                  iVar3 = iVar10;
                  ::std::__cxx11::wstring::_M_append
                            ((wchar_t *)local_c8,local_a8._M_allocated_capacity);
                  ::std::__cxx11::wstring::_M_append
                            ((wchar_t *)local_c8,(ulong)local_110.str._M_dataplus._M_p);
                }
                core::string<wchar_t>::operator=(&local_110,L"");
                core::string<wchar_t>::operator=((string<wchar_t> *)&local_a8,L"");
                uVar8 = local_f0 & 0xffffffff;
              }
              if ((char)uVar8 != '\0') {
                ::std::__cxx11::wstring::_M_replace_aux((ulong)&local_a8,local_a8._8_8_,0,L'\x01');
              }
              iVar10 = iVar3;
              if (bVar14) {
                ::std::__cxx11::wstring::_M_append
                          ((wchar_t *)local_c8,local_a8._M_allocated_capacity);
                ::std::__cxx11::wstring::_M_append
                          ((wchar_t *)local_c8,(ulong)local_110.str._M_dataplus._M_p);
                std::
                vector<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>::
                push_back((vector<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>
                           *)local_120,(string<wchar_t> *)local_c8);
                (this->BrokenText).is_sorted = false;
                core::string<wchar_t>::operator=((string<wchar_t> *)local_c8,L"");
                core::string<wchar_t>::operator=(&local_110,L"");
                core::string<wchar_t>::operator=((string<wchar_t> *)&local_a8,L"");
                iVar10 = 0;
              }
            }
            else {
              if (uVar4 == 0xd) {
                if (*(int *)(lVar7 + uVar11 * 4) == 10) {
                  lVar7 = ::std::__cxx11::wstring::_M_erase((ulong)local_88,uVar11);
                  uVar9 = (ulong)((int)uVar9 - 1);
                }
                goto LAB_00224e1f;
              }
              if ((uVar4 & 0xffffffdf) == 0) {
                bVar14 = false;
                uVar8 = CONCAT71((int7)((ulong)lVar7 >> 8),1);
                uVar12 = local_110.str._M_string_length;
                goto LAB_00224e2b;
              }
              ::std::__cxx11::wstring::_M_replace_aux
                        ((ulong)&local_110,local_110.str._M_string_length,0,L'\x01');
              if (uVar11 - 1 == (ulong)((int)uVar9 - 1)) {
                uVar8 = 0;
                bVar14 = false;
                uVar12 = local_110.str._M_string_length & 0xffffffff;
                goto LAB_00224e2b;
              }
            }
            bVar14 = (long)uVar11 < (long)(int)uVar9;
            uVar11 = uVar11 + 1;
          } while (bVar14);
        }
        ::std::__cxx11::wstring::_M_append((wchar_t *)local_c8,local_a8._M_allocated_capacity);
        ::std::__cxx11::wstring::_M_append
                  ((wchar_t *)local_c8,(ulong)local_110.str._M_dataplus._M_p);
      }
      else {
        if (-1 < (int)uVar4) {
          uVar9 = 0;
          uVar11 = (ulong)(uVar4 & 0x7fffffff);
          do {
            uVar12 = uVar11 - 1;
            wVar13 = *(wchar_t *)(*local_88 + 4 + uVar12 * 4);
            bVar14 = true;
            if (wVar13 == L'\n') {
LAB_00224926:
              wVar13 = L'\0';
LAB_00224929:
              pIVar2 = local_80;
              if ((int)local_110.str._M_string_length != 0) {
                iVar10 = (*local_80->_vptr_IGUIFont[1])(local_80,local_a8._M_allocated_capacity);
                uVar4 = (*pIVar2->_vptr_IGUIFont[1])(pIVar2,local_110.str._M_dataplus._M_p);
                if (((int)uVar9 == 0) || ((int)((int)uVar9 + iVar10 + uVar4) <= local_114)) {
                  local_f0 = uVar9;
                  local_78 = CONCAT44(extraout_var,iVar10);
                  core::string<wchar_t>::operator+
                            (&local_140,(string<wchar_t> *)&local_a8,(string<wchar_t> *)local_c8);
                  ::std::__cxx11::wstring::_M_assign((wstring *)local_c8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                       *)local_140.str._M_dataplus._M_p != &local_140.str.field_2) {
                    operator_delete(local_140.str._M_dataplus._M_p,
                                    local_140.str.field_2._M_allocated_capacity * 4 + 4);
                  }
                  core::string<wchar_t>::operator+
                            (&local_140,&local_110,(string<wchar_t> *)local_c8);
                  ::std::__cxx11::wstring::_M_assign((wstring *)local_c8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                       *)local_140.str._M_dataplus._M_p != &local_140.str.field_2) {
                    operator_delete(local_140.str._M_dataplus._M_p,
                                    local_140.str.field_2._M_allocated_capacity * 4 + 4);
                  }
                  uVar4 = (int)local_f0 + (int)local_78 + uVar4;
                }
                else {
                  std::
                  vector<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>::
                  push_back((vector<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>
                             *)local_120,(value_type *)local_c8);
                  (this->BrokenText).is_sorted = false;
                  ::std::__cxx11::wstring::_M_assign((wstring *)local_c8);
                }
                core::string<wchar_t>::operator=(&local_110,L"");
                core::string<wchar_t>::operator=((string<wchar_t> *)&local_a8,L"");
                uVar9 = (ulong)uVar4;
              }
              if (wVar13 != L'\0') {
                local_e8.str._M_dataplus._M_p = (pointer)&local_e8.str.field_2;
                local_e8.str._M_string_length = 0;
                local_e8.str.field_2._M_local_buf[0] = L'\0';
                local_f0 = uVar9;
                ::std::__cxx11::wstring::resize((ulong)&local_e8,L'\x01');
                *local_e8.str._M_dataplus._M_p = wVar13;
                core::string<wchar_t>::operator+(&local_140,&local_e8,(string<wchar_t> *)&local_a8);
                ::std::__cxx11::wstring::_M_assign((wstring *)&local_a8);
                if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                     *)local_140.str._M_dataplus._M_p != &local_140.str.field_2) {
                  operator_delete(local_140.str._M_dataplus._M_p,
                                  local_140.str.field_2._M_allocated_capacity * 4 + 4);
                }
                uVar9 = local_f0;
                if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                     *)local_e8.str._M_dataplus._M_p != &local_e8.str.field_2) {
                  operator_delete(local_e8.str._M_dataplus._M_p,
                                  CONCAT44(local_e8.str.field_2._M_local_buf[1],
                                           local_e8.str.field_2._M_local_buf[0]) * 4 + 4);
                  uVar9 = local_f0;
                }
              }
              if (bVar14) {
                core::string<wchar_t>::operator+
                          (&local_140,(string<wchar_t> *)&local_a8,(string<wchar_t> *)local_c8);
                ::std::__cxx11::wstring::_M_assign((wstring *)local_c8);
                if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                     *)local_140.str._M_dataplus._M_p != &local_140.str.field_2) {
                  operator_delete(local_140.str._M_dataplus._M_p,
                                  local_140.str.field_2._M_allocated_capacity * 4 + 4);
                }
                core::string<wchar_t>::operator+(&local_140,&local_110,(string<wchar_t> *)local_c8);
                ::std::__cxx11::wstring::_M_assign((wstring *)local_c8);
                if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                     *)local_140.str._M_dataplus._M_p != &local_140.str.field_2) {
                  operator_delete(local_140.str._M_dataplus._M_p,
                                  local_140.str.field_2._M_allocated_capacity * 4 + 4);
                }
                std::
                vector<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>::
                push_back((vector<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>
                           *)local_120,(string<wchar_t> *)local_c8);
                (this->BrokenText).is_sorted = false;
                core::string<wchar_t>::operator=((string<wchar_t> *)local_c8,L"");
                core::string<wchar_t>::operator=(&local_110,L"");
                core::string<wchar_t>::operator=((string<wchar_t> *)&local_a8,L"");
                uVar9 = 0;
              }
            }
            else {
              if (wVar13 == L'\r') {
                if ((uVar12 != 0xffffffffffffffff) && (*(int *)(*local_88 + uVar12 * 4) == 10)) {
                  ::std::__cxx11::wstring::_M_erase((ulong)local_88,uVar12);
                }
                goto LAB_00224926;
              }
              bVar14 = false;
              if ((uVar12 == 0xffffffffffffffff) || ((wVar13 & 0xffffffdfU) == 0))
              goto LAB_00224929;
              local_e8.str._M_dataplus._M_p = (pointer)&local_e8.str.field_2;
              local_e8.str._M_string_length = 0;
              local_e8.str.field_2._M_local_buf[0] = L'\0';
              ::std::__cxx11::wstring::resize((ulong)&local_e8,L'\x01');
              *local_e8.str._M_dataplus._M_p = wVar13;
              core::string<wchar_t>::operator+(&local_140,&local_e8,&local_110);
              ::std::__cxx11::wstring::_M_assign((wstring *)&local_110);
              if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                   *)local_140.str._M_dataplus._M_p != &local_140.str.field_2) {
                operator_delete(local_140.str._M_dataplus._M_p,
                                local_140.str.field_2._M_allocated_capacity * 4 + 4);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                   *)local_e8.str._M_dataplus._M_p != &local_e8.str.field_2) {
                operator_delete(local_e8.str._M_dataplus._M_p,
                                CONCAT44(local_e8.str.field_2._M_local_buf[1],
                                         local_e8.str.field_2._M_local_buf[0]) * 4 + 4);
              }
            }
            bVar14 = -1 < (long)uVar11;
            uVar11 = uVar12;
          } while (uVar12 != 0xffffffffffffffff && bVar14);
        }
        core::string<wchar_t>::operator+
                  (&local_140,(string<wchar_t> *)&local_a8,(string<wchar_t> *)local_c8);
        ::std::__cxx11::wstring::_M_assign((wstring *)local_c8);
        paVar1 = &local_140.str.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_140.str._M_dataplus._M_p != paVar1) {
          operator_delete(local_140.str._M_dataplus._M_p,
                          local_140.str.field_2._M_allocated_capacity * 4 + 4);
        }
        core::string<wchar_t>::operator+(&local_140,&local_110,(string<wchar_t> *)local_c8);
        ::std::__cxx11::wstring::_M_assign((wstring *)local_c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_140.str._M_dataplus._M_p != paVar1) {
          operator_delete(local_140.str._M_dataplus._M_p,
                          local_140.str.field_2._M_allocated_capacity * 4 + 4);
        }
      }
      std::vector<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_>::
      push_back((vector<irr::core::string<wchar_t>,_std::allocator<irr::core::string<wchar_t>_>_> *)
                local_120,(value_type *)local_c8);
      (this->BrokenText).is_sorted = false;
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_a8._M_allocated_capacity != &local_98) {
        operator_delete((void *)local_a8._M_allocated_capacity,
                        CONCAT44(local_98._M_local_buf[1],local_98._M_local_buf[0]) * 4 + 4);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_110.str._M_dataplus._M_p != &local_110.str.field_2) {
        operator_delete(local_110.str._M_dataplus._M_p,
                        CONCAT44(local_110.str.field_2._M_local_buf[1],
                                 local_110.str.field_2._M_local_buf[0]) * 4 + 4);
      }
      if ((pointer)local_c8._0_8_ != (pointer)(local_c8 + 0x10)) {
        operator_delete((void *)local_c8._0_8_,local_c8._16_8_ * 4 + 4);
      }
    }
  }
  return;
}

Assistant:

void CGUIStaticText::breakText()
{
	if (!WordWrap)
		return;

	BrokenText.clear();

	IGUISkin *skin = Environment->getSkin();
	IGUIFont *font = getActiveFont();
	if (!font)
		return;

	LastBreakFont = font;

	core::stringw line;
	core::stringw word;
	core::stringw whitespace;
	s32 size = Text.size();
	s32 length = 0;
	s32 elWidth = RelativeRect.getWidth();
	if (Border)
		elWidth -= 2 * skin->getSize(EGDS_TEXT_DISTANCE_X);
	wchar_t c;

	// We have to deal with right-to-left and left-to-right differently
	// However, most parts of the following code is the same, it's just
	// some order and boundaries which change.
	if (!RightToLeft) {
		// regular (left-to-right)
		for (s32 i = 0; i < size; ++i) {
			c = Text[i];
			bool lineBreak = false;

			if (c == L'\r') { // Mac or Windows breaks
				lineBreak = true;
				if (Text[i + 1] == L'\n') { // Windows breaks
					Text.erase(i + 1);
					--size;
				}
				c = '\0';
			} else if (c == L'\n') { // Unix breaks
				lineBreak = true;
				c = '\0';
			}

			bool isWhitespace = (c == L' ' || c == 0);
			if (!isWhitespace) {
				// part of a word
				word += c;
			}

			if (isWhitespace || i == (size - 1)) {
				if (word.size()) {
					// here comes the next whitespace, look if
					// we must break the last word to the next line.
					const s32 whitelgth = font->getDimension(whitespace.c_str()).Width;
					const s32 wordlgth = font->getDimension(word.c_str()).Width;

					if (wordlgth > elWidth) {
						// This word is too long to fit in the available space, look for
						// the Unicode Soft HYphen (SHY / 00AD) character for a place to
						// break the word at
						int where = word.findFirst(wchar_t(0x00AD));
						if (where != -1) {
							core::stringw first = word.subString(0, where);
							core::stringw second = word.subString(where, word.size() - where);
							BrokenText.push_back(line + first + L"-");
							const s32 secondLength = font->getDimension(second.c_str()).Width;

							length = secondLength;
							line = second;
						} else {
							// No soft hyphen found, so there's nothing more we can do
							// break to next line
							if (length)
								BrokenText.push_back(line);
							length = wordlgth;
							line = word;
						}
					} else if (length && (length + wordlgth + whitelgth > elWidth)) {
						// break to next line
						BrokenText.push_back(line);
						length = wordlgth;
						line = word;
					} else {
						// add word to line
						line += whitespace;
						line += word;
						length += whitelgth + wordlgth;
					}

					word = L"";
					whitespace = L"";
				}

				if (isWhitespace) {
					whitespace += c;
				}

				// compute line break
				if (lineBreak) {
					line += whitespace;
					line += word;
					BrokenText.push_back(line);
					line = L"";
					word = L"";
					whitespace = L"";
					length = 0;
				}
			}
		}

		line += whitespace;
		line += word;
		BrokenText.push_back(line);
	} else {
		// right-to-left
		for (s32 i = size; i >= 0; --i) {
			c = Text[i];
			bool lineBreak = false;

			if (c == L'\r') { // Mac or Windows breaks
				lineBreak = true;
				if ((i > 0) && Text[i - 1] == L'\n') { // Windows breaks
					Text.erase(i - 1);
					--size;
				}
				c = '\0';
			} else if (c == L'\n') { // Unix breaks
				lineBreak = true;
				c = '\0';
			}

			if (c == L' ' || c == 0 || i == 0) {
				if (word.size()) {
					// here comes the next whitespace, look if
					// we must break the last word to the next line.
					const s32 whitelgth = font->getDimension(whitespace.c_str()).Width;
					const s32 wordlgth = font->getDimension(word.c_str()).Width;

					if (length && (length + wordlgth + whitelgth > elWidth)) {
						// break to next line
						BrokenText.push_back(line);
						length = wordlgth;
						line = word;
					} else {
						// add word to line
						line = whitespace + line;
						line = word + line;
						length += whitelgth + wordlgth;
					}

					word = L"";
					whitespace = L"";
				}

				if (c != 0)
					whitespace = core::stringw(&c, 1) + whitespace;

				// compute line break
				if (lineBreak) {
					line = whitespace + line;
					line = word + line;
					BrokenText.push_back(line);
					line = L"";
					word = L"";
					whitespace = L"";
					length = 0;
				}
			} else {
				// yippee this is a word..
				word = core::stringw(&c, 1) + word;
			}
		}

		line = whitespace + line;
		line = word + line;
		BrokenText.push_back(line);
	}
}